

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshFaceListBlock(Parser *this,uint iNumFaces,Mesh *mesh)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_> *this_00;
  int local_c4;
  Face local_b8;
  
  this_00 = &(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces;
  std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::resize
            (this_00,(ulong)iNumFaces);
  local_c4 = 0;
  do {
    while( true ) {
      pbVar2 = (byte *)this->filePtr;
      bVar3 = *pbVar2;
      if (bVar3 != 0x2a) break;
      this->filePtr = (char *)(pbVar2 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_FACE",9);
      if (!bVar1) {
        pbVar2 = (byte *)this->filePtr;
        bVar3 = *pbVar2;
        break;
      }
      local_b8.super_FaceWithSmoothingGroup.mIndices[0] = 0xffffffff;
      local_b8.super_FaceWithSmoothingGroup.mIndices[1] = 0xffffffff;
      local_b8.super_FaceWithSmoothingGroup.mIndices[2] = 0xffffffff;
      local_b8.super_FaceWithSmoothingGroup.iSmoothGroup = 0;
      local_b8.iMaterial = 0xffffffff;
      local_b8.iFace = 0;
      ParseLV4MeshFace(this,&local_b8);
      if (local_b8.iFace < iNumFaces) {
        memcpy((this_00->super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>).
               _M_impl.super__Vector_impl_data._M_start + local_b8.iFace,&local_b8,0x84);
      }
      else {
        LogWarning(this,"Face has an invalid index. It will be ignored");
      }
    }
    if ((bVar3 - 0xc < 2) || (bVar3 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e1dd6;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar3 == 0x7b) {
        local_c4 = local_c4 + 1;
      }
      else if (bVar3 == 0x7d) {
        local_c4 = local_c4 + -1;
        if (local_c4 == 0) {
          this->filePtr = (char *)(pbVar2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar3 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_FACE_LIST chunk (Level 3)");
      }
LAB_003e1dd6:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar2 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshFaceListBlock(unsigned int iNumFaces, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the face array
    mesh.mFaces.resize(iNumFaces);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_FACE" ,9))
            {

                ASE::Face mFace;
                ParseLV4MeshFace(mFace);

                if (mFace.iFace >= iNumFaces)
                {
                    LogWarning("Face has an invalid index. It will be ignored");
                }
                else mesh.mFaces[mFace.iFace] = mFace;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_FACE_LIST");
    }
    return;
}